

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

void __thiscall pbrt::syntactic::ParamArray<float>::add(ParamArray<float> *this,string *text)

{
  allocator<char> local_35;
  float local_34;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,(text->_M_dataplus)._M_p,&local_35);
  local_34 = std::__cxx11::stof(&local_30,(size_t *)0x0);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>
            (&this->super_vector<float,_std::allocator<float>_>,&local_34);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void ParamArray<float>::add(const std::string &text)
    { this->push_back(std::stof(text.c_str())); }